

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O3

void exesaveit(voccxdef *ctx,vocoldef *dolist)

{
  byte bVar1;
  runcxdef *ctx_00;
  objnum oVar2;
  uint uVar3;
  ulong uVar4;
  char *s;
  
  bVar1 = ctx->voccxflg;
  ctx_00 = ctx->voccxrun;
  uVar3 = voclistlen(dolist);
  if (uVar3 == 1) {
    if ((dolist->vocolflg != 0x10) && (dolist->vocolflg != 0x400)) {
      oVar2 = dolist->vocolobj;
      ctx->voccxit = oVar2;
      ctx->voccxthc = 0;
      if ((bVar1 & 4) != 0) {
        outformat(".. setting it: ");
        runpprop(ctx_00,(uchar **)0x0,0,0,ctx->voccxit,8,0,0,ctx->voccxit);
        outformat("\\n");
        oVar2 = ctx->voccxit;
      }
      runpprop(ctx_00,(uchar **)0x0,0,0,oVar2,0x1d,0,0,oVar2);
      if ((ctx_00->runcxsp[-1].runstyp == '\b') && (ctx->voccxhim = ctx->voccxit, (bVar1 & 4) != 0))
      {
        outformat("... [setting \"him\" to same object]\\n");
      }
      ctx_00->runcxsp = ctx_00->runcxsp + -1;
      runpprop(ctx_00,(uchar **)0x0,0,0,ctx->voccxit,0x1e,0,0,ctx->voccxit);
      if ((ctx_00->runcxsp[-1].runstyp == '\b') && (ctx->voccxher = ctx->voccxit, (bVar1 & 4) != 0))
      {
        outformat("... [setting \"her\" to same object]\\n");
      }
      ctx_00->runcxsp = ctx_00->runcxsp + -1;
    }
  }
  else if (1 < (int)uVar3) {
    ctx->voccxthc = (objnum)uVar3;
    ctx->voccxit = 0xffff;
    if ((bVar1 & 4) != 0) {
      outformat(".. setting \"them\": [");
    }
    uVar4 = 0;
    do {
      oVar2 = dolist[uVar4].vocolobj;
      ctx->voccxthm[uVar4] = oVar2;
      if ((bVar1 & 4) != 0) {
        runpprop(ctx_00,(uchar **)0x0,0,0,oVar2,8,0,0,oVar2);
        s = "]\\n";
        if ((long)(uVar4 + 1) < (long)(ulong)uVar3) {
          s = ", ";
        }
        outformat(s);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

static void exesaveit(voccxdef *ctx, vocoldef *dolist)
{
    int       cnt;
    int       i;
    int       dbg = ctx->voccxflg & VOCCXFDBG;
    runcxdef *rcx = ctx->voccxrun;

    cnt = voclistlen(dolist);
    if (cnt == 1)
    {
        /*
         *   check to make sure they're not referring to a number or a
         *   string; if so, it doesn't make any sense to save it 
         */
        if (dolist[0].vocolflg == VOCS_STR
            || dolist[0].vocolflg == VOCS_NUM)
        {
            /* 
             *   As of 2.5.11, don't clear 'it' on a number or string;
             *   rather, just leave it as it was from the prior command.
             *   Players will almost never expect a number or string to have
             *   anything to do with pronoun antecedents, and in fact some
             *   players reported finding it confusing to have the antecedant
             *   implied by the second-most-recent command disappear when the
             *   most recent command used a number of string.  
             */
#if 0
            /* save a nil 'it' */
            ctx->voccxit = MCMONINV;
            if (dbg)
                tioputs(ctx->voccxtio,
                        ".. setting 'it' to nil (strObj/numObj)\\n");
#endif

            /* we're done */
            return;
        }

        /* save 'it' */
        ctx->voccxit = dolist[0].vocolobj;
        ctx->voccxthc = 0;

        if (dbg)
        {
            tioputs(ctx->voccxtio, ".. setting it: ");
            runppr(rcx, ctx->voccxit, PRP_SDESC, 0);
            tioputs(ctx->voccxtio, "\\n");
        }

        /* set "him" if appropriate */
        runppr(rcx, ctx->voccxit, PRP_ISHIM, 0);
        if (runtostyp(rcx) == DAT_TRUE)
        {
            ctx->voccxhim = ctx->voccxit;
            if (dbg)
                tioputs(ctx->voccxtio,
                        "... [setting \"him\" to same object]\\n");
        }
        rundisc(rcx);

        /* set "her" if appropriate */
        runppr(rcx, ctx->voccxit, PRP_ISHER, 0);
        if (runtostyp(rcx) == DAT_TRUE)
        {
            ctx->voccxher = ctx->voccxit;
            if (dbg)
                tioputs(ctx->voccxtio,
                        "... [setting \"her\" to same object]\\n");
        }
        rundisc(rcx);
    }
    else if (cnt > 1)
    {
        ctx->voccxthc = cnt;
        ctx->voccxit  = MCMONINV;
        if (dbg) tioputs(ctx->voccxtio, ".. setting \"them\": [");
        for (i = 0 ; i < cnt ; ++i)
        {
            ctx->voccxthm[i] = dolist[i].vocolobj;
            if (dbg)
            {
                runppr(rcx, dolist[i].vocolobj, PRP_SDESC, 0);
                tioputs(ctx->voccxtio, i+1 < cnt ? ", " : "]\\n");
            }
        }
    }
}